

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mspm.hpp
# Opt level: O1

void __thiscall pg::MSPMSolver::todo_push(MSPMSolver *this,int node)

{
  int *piVar1;
  ostream *poVar2;
  int local_c;
  
  if (this->dirty[node] == 0) {
    piVar1 = (this->todo).super__Deque_base<int,_std::allocator<int>_>._M_impl.
             super__Deque_impl_data._M_finish._M_cur;
    local_c = node;
    if (piVar1 == (this->todo).super__Deque_base<int,_std::allocator<int>_>._M_impl.
                  super__Deque_impl_data._M_finish._M_last + -1) {
      std::deque<int,std::allocator<int>>::_M_push_back_aux<int_const&>
                ((deque<int,std::allocator<int>> *)&this->todo,&local_c);
    }
    else {
      *piVar1 = node;
      (this->todo).super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
      _M_finish._M_cur = piVar1 + 1;
    }
    this->dirty[local_c] = 1;
    if (1 < (this->super_Solver).trace) {
      poVar2 = (this->super_Solver).logger;
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"push(",5);
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_c);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,")",1);
      std::ios::widen((char)poVar2->_vptr_basic_ostream[-3] + (char)poVar2);
      std::ostream::put((char)poVar2);
      std::ostream::flush();
    }
  }
  return;
}

Assistant:

void todo_push(int node) {
        if (dirty[node]) return;
        todo.push_back(node);
        dirty[node] = 1;
        if (trace >= 2) logger << "push(" << node << ")" << std::endl;
    }